

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodBuilder.cpp
# Opt level: O0

uint8_t * __thiscall
Lodtalk::MethodAssembler::PushTemporal::encode(PushTemporal *this,uint8_t *buffer)

{
  uint8_t *buffer_local;
  PushTemporal *this_local;
  
  if (this->index < 0xc) {
    this_local = (PushTemporal *)(buffer + 1);
    *buffer = (char)this->index + '@';
  }
  else {
    *buffer = 0xe5;
    this_local = (PushTemporal *)(buffer + 2);
    buffer[1] = (uint8_t)this->index;
  }
  return (uint8_t *)this_local;
}

Assistant:

virtual uint8_t *encode(uint8_t *buffer)
	{
		if(index < 12)
		{
			*buffer++ = uint8_t(BytecodeSet::PushTempShortFirst + index);
			return buffer;
		}

		*buffer++ = BytecodeSet::PushTemporary;
		*buffer++ = (uint8_t)index;
		return buffer;
	}